

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

TestRequest *
anon_unknown.dwarf_2926b4::createTestRequest
          (TestRequest *__return_storage_ptr__,char *sender,char *target,int seq,char *id)

{
  char *__s;
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_178;
  FieldBase local_120;
  allocator<char> local_b1;
  STRING local_b0;
  TestReqID local_90;
  undefined1 local_31;
  char *local_30;
  char *id_local;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  TestRequest *testRequest;
  
  local_31 = 0;
  local_30 = id;
  id_local._4_4_ = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIX42::TestRequest::TestRequest(__return_storage_ptr__);
  __s = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_b1);
  FIX::TestReqID::TestReqID(&local_90,&local_b0);
  FIX42::TestRequest::set(__return_storage_ptr__,&local_90);
  FIX::TestReqID::~TestReqID(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,id_local._4_4_);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_120,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_120,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_120);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_178,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_178,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_178);
  return __return_storage_ptr__;
}

Assistant:

FIX42::TestRequest createTestRequest(const char *sender, const char *target, int seq, const char *id) {
  FIX42::TestRequest testRequest;
  testRequest.set(TestReqID(id));
  fillHeader(testRequest.getHeader(), sender, target, seq);
  testRequest.getHeader().setField(BodyLength(testRequest.bodyLength()));
  testRequest.getTrailer().setField(CheckSum(testRequest.checkSum()));
  return testRequest;
}